

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::SetArray(ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
           *this,IDeviceObject **ppObjects,Uint32 FirstElement,Uint32 NumElements,
          SET_SHADER_RESOURCE_FLAGS Flags)

{
  Char *Message;
  uint *in_stack_ffffffffffffff60;
  BindResourceInfo local_88;
  uint local_68;
  Uint32 elem;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  string msg;
  PipelineResourceDesc *Desc;
  SET_SHADER_RESOURCE_FLAGS Flags_local;
  Uint32 NumElements_local;
  Uint32 FirstElement_local;
  IDeviceObject **ppObjects_local;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_local;
  
  Flags_local = FirstElement;
  _NumElements_local = ppObjects;
  ppObjects_local = (IDeviceObject **)this;
  msg.field_2._8_8_ = GetDesc(this);
  if (((PipelineResourceDesc *)msg.field_2._8_8_)->ArraySize < Flags_local + NumElements) {
    local_54 = (Flags_local - SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) + NumElements;
    local_58 = ((PipelineResourceDesc *)msg.field_2._8_8_)->ArraySize - 1;
    FormatString<char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
              ((string *)local_50,(Diligent *)"SetArray arguments are invalid for \'",
               (char (*) [37])msg.field_2._8_8_,(char **)"\' variable: specified element range (",
               (char (*) [38])&Flags_local,(uint *)0xe3e653,(char (*) [5])&local_54,
               (uint *)") is out of array bounds 0 .. ",(char (*) [31])&local_58,
               in_stack_ffffffffffffff60);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2ab);
    std::__cxx11::string::~string((string *)local_50);
  }
  for (local_68 = 0; local_68 < NumElements; local_68 = local_68 + 1) {
    BindResourceInfo::BindResourceInfo
              (&local_88,Flags_local + local_68,_NumElements_local[local_68],Flags,0,0);
    ShaderVariableManagerGL::StorageBufferBindInfo::BindResource
              ((StorageBufferBindInfo *)this,&local_88);
  }
  return;
}

Assistant:

SetArray(IDeviceObject* const*     ppObjects,
                                             Uint32                    FirstElement,
                                             Uint32                    NumElements,
                                             SET_SHADER_RESOURCE_FLAGS Flags) override final
    {
        const PipelineResourceDesc& Desc = GetDesc();

        DEV_CHECK_ERR(FirstElement + NumElements <= Desc.ArraySize,
                      "SetArray arguments are invalid for '", Desc.Name, "' variable: specified element range (", FirstElement, " .. ",
                      FirstElement + NumElements - 1, ") is out of array bounds 0 .. ", Desc.ArraySize - 1);

        for (Uint32 elem = 0; elem < NumElements; ++elem)
            static_cast<ThisImplType*>(this)->BindResource(BindResourceInfo{FirstElement + elem, ppObjects[elem], Flags});
    }